

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_common.h
# Opt level: O1

istreambuf_iterator<char,_std::char_traits<char>_> *
date::skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>
          (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
          istreambuf_iterator<char,_std::char_traits<char>_> *end)

{
  streambuf_type *psVar1;
  ulong uVar2;
  int_type iVar3;
  int_type iVar4;
  ulong uVar5;
  
  iVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
  iVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(end);
  if ((iVar3 == -1) != (iVar4 == -1)) {
    do {
      iVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
      if ((char)iVar3 != ' ') {
        uVar2 = 0;
        do {
          uVar5 = uVar2;
          if (uVar5 == 5) break;
          uVar2 = uVar5 + 1;
        } while ((&DAT_0010a021)[uVar5] != (char)iVar3);
        if (4 < uVar5) {
          return pos;
        }
      }
      psVar1 = pos->_M_sbuf;
      if (*(ulong *)(psVar1 + 0x10) < *(ulong *)(psVar1 + 0x18)) {
        *(ulong *)(psVar1 + 0x10) = *(ulong *)(psVar1 + 0x10) + 1;
      }
      else {
        (**(code **)(*(long *)psVar1 + 0x50))();
      }
      pos->_M_c = -1;
      iVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
      iVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(end);
    } while ((iVar4 == -1) != (iVar3 == -1));
  }
  return pos;
}

Assistant:

Iterator& skip_spaces(Iterator& pos, const Iterator& end)
{
    using char_type = typename iterator_traits<Iterator>::value_type;
    for (; pos != end; ++pos)
    {
        const char_type ch = *pos;
        constexpr auto spaces = make_static_string<char_type>(" \t\n\v\f\r");
        if (!spaces.contains(ch))
            break;
    }
    return pos;
}